

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::FindEQ
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  Addr p;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  __type local_115;
  string local_b8 [36];
  int local_94;
  undefined1 local_8d;
  int pos;
  Addr AStack_88;
  int i;
  Addr Cp;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ret;
  
  C.self = (Addr)k;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&Cp,this->N);
  local_8d = 0;
  std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::set(__return_storage_ptr__);
  std::__cxx11::string::string(local_b8,(string *)k);
  iVar2 = FindFirstKey(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b8,&stack0xffffffffffffff78);
  std::__cxx11::string::~string(local_b8);
  local_94 = iVar2;
  FindNode(this,AStack_88,
           (IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&Cp);
  if (local_94 != -1) {
    do {
      while( true ) {
        pos = local_94;
        while( true ) {
          local_115 = false;
          if (pos < this->N + -1) {
            pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)pos);
            local_115 = false;
            if (*pvVar3 == '1') {
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&C,(long)pos);
              local_115 = std::operator==(pvVar4,k);
            }
          }
          if (local_115 == false) break;
          pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                             ((vector<Addr,_std::allocator<Addr>_> *)
                              &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x10,(long)pos);
          std::set<Addr,_std::less<Addr>,_std::allocator<Addr>_>::insert
                    (__return_storage_ptr__,pvVar5);
          pos = pos + 1;
        }
        if (((pos == this->N + -1) ||
            (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                                ((vector<char,_std::allocator<char>_> *)
                                 &C.k.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)pos),
            *pvVar3 == '0')) &&
           (pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                               ((vector<Addr,_std::allocator<Addr>_> *)
                                &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 field_0x10,(long)(this->N + -1)), pvVar5->FileOff == -1))
        goto LAB_00172250;
        if ((pos != this->N + -1) &&
           (pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)
                                &C.k.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)pos),
           *pvVar3 != '0')) break;
        local_94 = 0;
        pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                           ((vector<Addr,_std::allocator<Addr>_> *)
                            &C.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10,
                            (long)(this->N + -1));
        p.BlockNum = pvVar5->BlockNum;
        p.FileOff = pvVar5->FileOff;
        FindNode(this,p,(IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&Cp);
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&C,(long)pos);
      bVar1 = std::operator!=(pvVar4,k);
    } while (!bVar1);
  }
LAB_00172250:
  local_8d = 1;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode((IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&Cp);
  return __return_storage_ptr__;
}

Assistant:

set<Addr> BpTree<K>::FindEQ(K k) {
	IndexNode<K> C(N);
	Addr Cp;
	int i;
	set<Addr> ret;
	int pos = this->FindFirstKey(k, Cp);
	this->FindNode(Cp, C);			//C.k[pos]�ǵ�һ����ֵΪk�ĵط�
	if (pos == -1)
		return ret;					//�Ҳ����ü�ֵ�����ؿ�����
	while (1) {
		for (i = pos; i < N - 1 && C.v[i] == '1' && C.k[i] == k; i++) {
			ret.insert(C.p[i]);
		}
		if ((i == N - 1 || C.v[i] == '0') && C.p[N - 1].FileOff == -1) {
			break;									//��ͷ��
		}
		else if (i == N - 1 || C.v[i] == '0') {		//��Ҷ���������һ�����
			pos = 0;
			this->FindNode(C.p[N - 1], C);
		}
		else if (C.k[i] != k) {
			break;									//�ҵ���һ���������������λ��
		}
	}
	return ret;
}